

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool test_SSTable_input(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::list<int,_std::allocator<int>_>_> __l_01;
  list<int,_std::allocator<int>_> *local_110;
  allocator<std::__cxx11::list<int,_std::allocator<int>_>_> local_db;
  undefined1 local_da;
  allocator<int> local_d9;
  int local_d8 [6];
  iterator local_c0;
  size_type local_b8;
  allocator<int> local_99;
  int local_98 [8];
  iterator local_78;
  size_type local_70;
  list<int,_std::allocator<int>_> *local_68;
  list<int,_std::allocator<int>_> local_60;
  list<int,_std::allocator<int>_> local_48;
  undefined1 local_30 [24];
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  l;
  
  local_da = 1;
  local_98[0] = 1;
  local_98[1] = 2;
  local_98[2] = 3;
  local_98[3] = 4;
  local_98[4] = 5;
  local_78 = local_98;
  local_70 = 5;
  local_68 = &local_60;
  std::allocator<int>::allocator(&local_99);
  __l_00._M_len = local_70;
  __l_00._M_array = local_78;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_60,__l_00,&local_99);
  local_d8[0] = 6;
  local_d8[1] = 7;
  local_d8[2] = 8;
  local_d8[3] = 9;
  local_d8[4] = 10;
  local_c0 = local_d8;
  local_b8 = 5;
  local_68 = &local_48;
  std::allocator<int>::allocator(&local_d9);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_48,__l,&local_d9);
  local_da = 0;
  local_30._0_8_ = &local_60;
  local_30._8_8_ = (_List_node_base *)0x2;
  std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>::allocator(&local_db);
  __l_01._M_len = local_30._8_8_;
  __l_01._M_array = (iterator)local_30._0_8_;
  std::__cxx11::
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          *)(local_30 + 0x10),__l_01,&local_db);
  std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>::~allocator(&local_db);
  local_110 = (list<int,_std::allocator<int>_> *)local_30;
  do {
    local_110 = local_110 + -1;
    std::__cxx11::list<int,_std::allocator<int>_>::~list(local_110);
  } while (local_110 != &local_60);
  std::allocator<int>::~allocator(&local_d9);
  std::allocator<int>::~allocator(&local_99);
  std::__cxx11::
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::~list((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           *)(local_30 + 0x10));
  return true;
}

Assistant:

bool test_SSTable_input() {
    auto l = std::list<std::list<int>>{{1, 2, 3, 4, 5},
                                       {6, 7, 8, 9, 10}};
    return true;
}